

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O3

void __thiscall
pstd::
vector<pstd::optional<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
::clear(vector<pstd::optional<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        *this)

{
  optional<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *poVar1;
  long *plVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  
  uVar3 = this->nStored;
  if (uVar3 != 0) {
    lVar4 = 0x18;
    uVar5 = 0;
    do {
      poVar1 = this->ptr;
      if ((poVar1->optionalValue).__data[lVar4 + 0x10] == '\x01') {
        plVar2 = *(long **)((long)poVar1 + lVar4 + -0x10);
        if ((long *)((poVar1->optionalValue).__data + lVar4) != plVar2) {
          operator_delete(plVar2,*(long *)((poVar1->optionalValue).__data + lVar4) + 1);
          uVar3 = this->nStored;
        }
        (poVar1->optionalValue).__data[lVar4 + 0x10] = '\0';
      }
      uVar5 = uVar5 + 1;
      lVar4 = lVar4 + 0x30;
    } while (uVar5 < uVar3);
  }
  this->nStored = 0;
  return;
}

Assistant:

void clear() {
        for (int i = 0; i < nStored; ++i)
            alloc.destroy(&ptr[i]);
        nStored = 0;
    }